

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZSS.cpp
# Opt level: O2

void DatUnpacker::LZSS::decompress(uchar *input,uint inputSize,uchar *output,uint outputSize)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  bool bVar12;
  uchar dictionary [4096];
  
  pbVar3 = input + inputSize;
  pbVar10 = output + outputSize;
  while( true ) {
    if (pbVar3 <= input) {
      return;
    }
    bVar4 = *input;
    uVar8 = (long)(short)((ushort)bVar4 << 8) | (ulong)input[1];
    if ((short)uVar8 == 0) break;
    input = input + 2;
    if ((short)((ushort)bVar4 << 8) < 0) {
      pbVar9 = input + -uVar8;
      for (; (input < pbVar9 && (output < pbVar10)); output = output + 1) {
        bVar4 = *input;
        input = input + 1;
        *output = bVar4;
      }
    }
    else {
      memset(dictionary,0x20,0x1000);
      pbVar9 = input + uVar8;
      uVar2 = 0xfee;
      while (input < pbVar9) {
        bVar4 = *input;
        iVar5 = 0;
        input = input + 1;
        while ((iVar5 != 8 && (input < pbVar9))) {
          pbVar11 = input + 1;
          bVar1 = *input;
          if ((bVar4 & 1) == 0) {
            iVar6 = (*pbVar11 & 0xf) + 3;
            uVar7 = (uint)bVar1 | (*pbVar11 & 0xf0) << 4;
            while (bVar12 = iVar6 != 0, iVar6 = iVar6 + -1, bVar12) {
              bVar1 = dictionary[uVar7 & 0xffff];
              *output = bVar1;
              output = output + 1;
              dictionary[uVar2] = bVar1;
              uVar2 = uVar2 + 1;
              if (0xfff < uVar2) {
                uVar2 = 0;
              }
              uVar7 = uVar7 + 1;
              if (0xfff < (ushort)uVar7) {
                uVar7 = 0;
              }
            }
            pbVar11 = input + 2;
          }
          else {
            *output = bVar1;
            output = output + 1;
            dictionary[uVar2] = bVar1;
            uVar2 = uVar2 + 1;
            if (0xfff < uVar2) {
              uVar2 = 0;
            }
          }
          bVar4 = bVar4 >> 1;
          iVar5 = iVar5 + 1;
          input = pbVar11;
        }
      }
    }
  }
  return;
}

Assistant:

void  LZSS::decompress(unsigned char* input, unsigned int inputSize, unsigned char* output, unsigned int outputSize)
    {
        const unsigned short D = 4096;
        unsigned short DO, DI = 0;
        short N;
        unsigned char dictionary[D];
        unsigned char F = 0;
        unsigned char L = 0;
        unsigned char* inputEnd = input + inputSize;
        unsigned char* outputEnd = output + outputSize;

        while (input < inputEnd)
        {

            N = *(input++) << 8;
            N |= *(input++);
            if (N == 0) return;

            if (N < 0)
            {
                unsigned char* end = input - N;
                while (input < end && output < outputEnd)
                {
                    unsigned char byte = *(input++);
                    *(output++) = byte;
                }
            }
            else
            {
                DO = D-18;
                memset(dictionary, ' ', D);
                unsigned char* end = input + N;
                while (input < end)
                {
                    F = *(input++);
                    for (unsigned int i = 0; i != 8 && input < end; ++i)
                    {
                        if ((F & 1) != 0)
                        {
                            unsigned char byte = *(input++);
                            *(output++) = byte;
                            dictionary[DO] = byte;
                            DO++;
                            if (DO >= D) DO = 0;
                        }
                        else
                        {
                            DI = *(input++);
                            L = *(input++);
                            DI = DI | ((0xF0 & L) << 4);
                            L &= 0x0F;

                            for (int j = 0; j < L+3; j++)
                            {
                                unsigned char byte = dictionary[DI];
                                *(output++) = byte;
                                dictionary[DO] = byte;
                                DI++;
                                DO++;
                                if (DO >= D) DO = 0;
                                if (DI >= D) DI = 0;
                            }
                        }
                        F >>= 1;
                    }
                }
            }
        }
    }